

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_DirectDependencies_NoViolation_Test::TestBody
          (CommandLineInterfaceTest_DirectDependencies_NoViolation_Test *this)

{
  allocator<char> local_71;
  string local_70;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_DirectDependencies_NoViolation_Test *local_10;
  CommandLineInterfaceTest_DirectDependencies_NoViolation_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "syntax = \"proto2\";\nimport \"bar.proto\";\nmessage Foo { optional Bar bar = 1; }");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"bar.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"syntax = \"proto2\";\nmessage Bar { optional string text = 1; }");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_40,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir --direct_dependencies=bar.proto foo.proto"
             ,&local_71);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, DirectDependencies_NoViolation) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "import \"bar.proto\";\n"
                 "message Foo { optional Bar bar = 1; }");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "message Bar { optional string text = 1; }");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir "
      "--direct_dependencies=bar.proto foo.proto");

  ExpectNoErrors();
}